

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O0

bool __thiscall
S2::GetIntersectionStableSorted<long_double>
          (S2 *this,Vector3<long_double> *a0,Vector3<long_double> *a1,Vector3<long_double> *b0,
          Vector3<long_double> *b1,Vector3<long_double> *result)

{
  ostream *poVar1;
  BasicVector<Vector3,_long_double,_3UL> *pBVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST6;
  longdouble in_ST7;
  double __x;
  double __x_00;
  double __x_01;
  double dVar6;
  longdouble local_328;
  Vector3<long_double> local_318;
  undefined1 auStack_2e8 [8];
  longdouble kMaxError;
  longdouble x_len;
  longdouble x_len2;
  longdouble error;
  longdouble T_ERR;
  BasicVector<Vector3,_long_double,_3UL> local_268 [48];
  undefined1 local_238 [8];
  Vector3<long_double> x;
  longdouble error_sum;
  longdouble dist_sum;
  longdouble b1_dist;
  longdouble b0_dist;
  longdouble b1_error;
  longdouble b0_error;
  undefined1 auStack_178 [8];
  longdouble b_len;
  longdouble a_norm_len;
  BasicVector<Vector3,_long_double,_3UL> local_128 [48];
  undefined1 local_f8 [8];
  Vector3<long_double> a_norm;
  S2LogMessage local_b0;
  S2LogMessageVoidify local_99;
  D local_98;
  D local_68;
  Vector3<long_double> *local_38;
  Vector3<long_double> *result_local;
  Vector3<long_double> *b1_local;
  Vector3<long_double> *b0_local;
  Vector3<long_double> *a1_local;
  Vector3<long_double> *a0_local;
  
  local_38 = b1;
  result_local = b0;
  b1_local = a1;
  b0_local = a0;
  a1_local = (Vector3<long_double> *)this;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            (&local_68,(BasicVector<Vector3,_long_double,_3UL> *)a0,(D *)this);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((longdouble *)&local_68,(BasicVector<Vector3,_long_double,_3UL> *)a0);
  pBVar2 = (BasicVector<Vector3,_long_double,_3UL> *)result_local;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            (&local_98,(BasicVector<Vector3,_long_double,_3UL> *)result_local,b1_local);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((longdouble *)&local_98,pBVar2);
  if (in_ST1 <= in_ST0) {
    pBVar2 = local_128;
    lVar3 = in_ST7;
    lVar4 = in_ST7;
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
              ((D *)pBVar2,(BasicVector<Vector3,_long_double,_3UL> *)a1_local,b0_local);
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
              ((D *)((long)&a_norm_len + 8),(BasicVector<Vector3,_long_double,_3UL> *)a1_local,
               b0_local);
    Vector3<long_double>::CrossProd
              ((Vector3<long_double> *)local_f8,(Vector3<long_double> *)pBVar2,
               (D *)((long)&a_norm_len + 8));
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
              ((FloatType *)local_f8,pBVar2);
    pBVar2 = (BasicVector<Vector3,_long_double,_3UL> *)result_local;
    lVar5 = lVar4;
    unique0x10000344 = in_ST2;
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
              ((D *)((long)&b0_error + 8),(BasicVector<Vector3,_long_double,_3UL> *)result_local,
               b1_local);
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
              ((FloatType *)((long)&b0_error + 8),pBVar2);
    _auStack_178 = in_ST3;
    GetProjection<long_double>
              ((longdouble *)b1_local,(Vector3<long_double> *)local_f8,a1_local,
               stack0xfffffffffffffe98,b0_local,(Vector3<long_double> *)((long)&b1_error + 8),
               (longdouble *)result);
    GetProjection<long_double>
              ((longdouble *)result_local,(Vector3<long_double> *)local_f8,a1_local,
               stack0xfffffffffffffe98,b0_local,(Vector3<long_double> *)((long)&b0_dist + 8),
               (longdouble *)result);
    std::fabs(__x);
    register0x00001110 = stack0xfffffffffffffe38 + stack0xfffffffffffffe48;
    if (register0x00001110 < in_ST6) {
      pBVar2 = local_268;
      util::math::internal_vector::operator*
                ((Vector3<long_double> *)pBVar2,(longdouble *)((long)&b1_dist + 8),
                 (BasicVector<Vector3,_long_double,_3UL> *)result_local);
      util::math::internal_vector::operator*
                ((Vector3<long_double> *)((long)&T_ERR + 8),(longdouble *)((long)&dist_sum + 8),
                 (BasicVector<Vector3,_long_double,_3UL> *)b1_local);
      util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
                ((D *)local_238,pBVar2,(Vector3<long_double> *)((long)&T_ERR + 8));
      register0x00001100 = (longdouble)5.421011e-20;
      std::fabs(__x_00);
      register0x00001110 =
           (longdouble)1.0842022e-19 * in_ST6 +
           (_auStack_178 * in_ST7) / (in_ST6 - stack0xfffffffffffffdf8);
      util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
                ((longdouble *)local_238,pBVar2);
      std::numeric_limits<long_double>::min();
      if (lVar4 <= lVar3) {
        std::sqrt(__x_01);
        unique0x10000330 = lVar5;
        dVar6 = S1Angle::radians((S1Angle *)&kIntersectionError);
        _auStack_2e8 = (longdouble)dVar6;
        if (stack0xfffffffffffffd48 <= (longdouble)8.881242e-16 * stack0xfffffffffffffd28) {
          local_328 = (longdouble)1 / stack0xfffffffffffffd28;
          util::math::internal_vector::operator*
                    (&local_318,&local_328,(BasicVector<Vector3,_long_double,_3UL> *)local_238);
          memcpy(local_38,&local_318,0x30);
          a0_local._7_1_ = true;
        }
        else {
          a0_local._7_1_ = false;
        }
      }
      else {
        a0_local._7_1_ = false;
      }
    }
    else {
      a0_local._7_1_ = false;
    }
    return a0_local._7_1_;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crossings.cc"
             ,0xfe,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_b0);
  poVar1 = std::operator<<(poVar1,"Check failed: ((a1 - a0).Norm2()) >= ((b1 - b0).Norm2()) ");
  S2LogMessageVoidify::operator&(&local_99,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_b0);
}

Assistant:

static bool GetIntersectionStableSorted(
    const Vector3<T>& a0, const Vector3<T>& a1,
    const Vector3<T>& b0, const Vector3<T>& b1, Vector3<T>* result) {
  S2_DCHECK_GE((a1 - a0).Norm2(), (b1 - b0).Norm2());

  // Compute the normal of the plane through (a0, a1) in a stable way.
  Vector3<T> a_norm = (a0 - a1).CrossProd(a0 + a1);
  T a_norm_len = a_norm.Norm();
  T b_len = (b1 - b0).Norm();

  // Compute the projection (i.e., signed distance) of b0 and b1 onto the
  // plane through (a0, a1).  Distances are scaled by the length of a_norm.
  T b0_error, b1_error;
  T b0_dist = GetProjection(b0, a_norm, a_norm_len, a0, a1, &b0_error);
  T b1_dist = GetProjection(b1, a_norm, a_norm_len, a0, a1, &b1_error);

  // The total distance from b0 to b1 measured perpendicularly to (a0,a1) is
  // |b0_dist - b1_dist|.  Note that b0_dist and b1_dist generally have
  // opposite signs because b0 and b1 are on opposite sides of (a0, a1).  The
  // code below finds the intersection point by interpolating along the edge
  // (b0, b1) to a fractional distance of b0_dist / (b0_dist - b1_dist).
  //
  // It can be shown that the maximum error in the interpolation fraction is
  //
  //     (b0_dist * b1_error - b1_dist * b0_error) /
  //        (dist_sum * (dist_sum - error_sum))
  //
  // We save ourselves some work by scaling the result and the error bound by
  // "dist_sum", since the result is normalized to be unit length anyway.
  T dist_sum = fabs(b0_dist - b1_dist);
  T error_sum = b0_error + b1_error;
  if (dist_sum <= error_sum) {
    return false;  // Error is unbounded in this case.
  }
  Vector3<T> x = b0_dist * b1 - b1_dist * b0;
  constexpr T T_ERR = s2pred::rounding_epsilon<T>();
  T error = b_len * fabs(b0_dist * b1_error - b1_dist * b0_error) /
      (dist_sum - error_sum) + 2 * T_ERR * dist_sum;

  // Finally we normalize the result, compute the corresponding error, and
  // check whether the total error is acceptable.
  T x_len2 = x.Norm2();
  if (x_len2 < std::numeric_limits<T>::min()) {
    // If x.Norm2() is less than the minimum normalized value of T, x_len might
    // lose precision and the result might fail to satisfy S2::IsUnitLength().
    // TODO(ericv): Implement S2::RobustNormalize().
    return false;
  }
  T x_len = sqrt(x_len2);
  const T kMaxError = kIntersectionError.radians();
  if (error > (kMaxError - T_ERR) * x_len) {
    return false;
  }
  *result = (1 / x_len) * x;
  return true;
}